

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

mzd_local_t * mzd_local_init_ex(uint r,uint c,_Bool clear)

{
  int iVar1;
  uint uVar2;
  mzd_local_t *pmVar3;
  undefined7 in_register_00000011;
  
  iVar1 = (int)((ulong)c + 0x3f >> 6);
  uVar2 = iVar1 + 1U & 6;
  if (0x80 < c) {
    uVar2 = iVar1 + 3U & 0xfffffffc;
  }
  pmVar3 = (mzd_local_t *)aligned_alloc(0x20);
  if ((int)CONCAT71(in_register_00000011,clear) != 0) {
    pmVar3 = (mzd_local_t *)memset(pmVar3,0,(ulong)r * (ulong)uVar2 * 8 + 0x1f & 0x7fffffffffffffe0)
    ;
    return pmVar3;
  }
  return pmVar3;
}

Assistant:

mzd_local_t* mzd_local_init_ex(unsigned int r, unsigned int c, bool clear) {
  const size_t rowstride = calculate_rowstride(calculate_width(c));

  const size_t buffer_size = r * rowstride * sizeof(word);
  const size_t alloc_size  = (buffer_size + 31) & ~31;

  /* We always align mzd_local_ts to 32 bytes. Thus the first row is always
   * aligned to 32 bytes as well. For 128 bit and SSE all other rows are then
   * aligned to 16 bytes. */
  unsigned char* buffer = picnic_aligned_alloc(32, alloc_size);
  if (clear) {
    memset(buffer, 0, alloc_size);
  }

  return (mzd_local_t*)buffer;
}